

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O1

bool boolFromString(string *value,bool *bool_value)

{
  size_type sVar1;
  pointer pcVar2;
  size_t __n;
  __type _Var3;
  int iVar4;
  bool bVar5;
  size_type sVar6;
  
  sVar1 = value->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (value->_M_dataplus)._M_p;
    sVar6 = 0;
    do {
      iVar4 = tolower((uint)(byte)pcVar2[sVar6]);
      pcVar2[sVar6] = (char)iVar4;
      sVar6 = sVar6 + 1;
    } while (sVar1 != sVar6);
  }
  iVar4 = std::__cxx11::string::compare((char *)value);
  bVar5 = true;
  if ((((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)value), iVar4 != 0)) &&
      (iVar4 = std::__cxx11::string::compare((char *)value), iVar4 != 0)) &&
     ((__n = value->_M_string_length, __n != kHighsOnString_abi_cxx11_._M_string_length ||
      ((__n != 0 &&
       (iVar4 = bcmp((value->_M_dataplus)._M_p,kHighsOnString_abi_cxx11_._M_dataplus._M_p,__n),
       iVar4 != 0)))))) {
    iVar4 = std::__cxx11::string::compare((char *)value);
    if ((iVar4 == 0) ||
       ((iVar4 = std::__cxx11::string::compare((char *)value), iVar4 == 0 ||
        (iVar4 = std::__cxx11::string::compare((char *)value), iVar4 == 0)))) {
      bVar5 = false;
    }
    else {
      _Var3 = std::operator==(value,&kHighsOffString_abi_cxx11_);
      bVar5 = false;
      if (!_Var3) {
        return false;
      }
    }
  }
  *bool_value = bVar5;
  return true;
}

Assistant:

bool boolFromString(std::string value, bool& bool_value) {
  std::transform(value.begin(), value.end(), value.begin(),
                 [](unsigned char c) { return std::tolower(c); });
  if (value == "t" || value == "true" || value == "1" ||
      value == kHighsOnString) {
    bool_value = true;
  } else if (value == "f" || value == "false" || value == "0" ||
             value == kHighsOffString) {
    bool_value = false;
  } else {
    return false;
  }
  return true;
}